

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-writer.c
# Opt level: O0

void labpack_write_cstr(labpack_writer_t *writer,char *value)

{
  _Bool _Var1;
  char *value_local;
  labpack_writer_t *writer_local;
  
  if (writer == (labpack_writer_t *)0x0) {
    __assert_fail("writer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-writer.c"
                  ,0x1b6,"void labpack_write_cstr(labpack_writer_t *, const char *)");
  }
  _Var1 = labpack_writer_is_ok(writer);
  if (_Var1) {
    if (value == (char *)0x0) {
      writer->status = LABPACK_STATUS_ERROR_NULL_VALUE;
      writer->status_message = NULL_CSTR_MESSAGE;
    }
    else {
      mpack_write_cstr(writer->encoder,value);
      labpack_writer_check_encoder(writer);
    }
  }
  return;
}

Assistant:

void
labpack_write_cstr(labpack_writer_t* writer, const char* value)
{
    assert(writer);
    if (labpack_writer_is_ok(writer)) {
        if (!value) {
            writer->status = LABPACK_STATUS_ERROR_NULL_VALUE;
            writer->status_message = NULL_CSTR_MESSAGE;
            return;
        }
        mpack_write_cstr(writer->encoder, value);
        labpack_writer_check_encoder(writer);
    }
}